

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_tokens_test.cc
# Opt level: O1

int main(void)

{
  char cVar1;
  char cVar2;
  bool bVar3;
  int iVar4;
  istream *piVar5;
  ostream *poVar6;
  string correct_result;
  string input_tree;
  string line;
  string computed_results;
  BracketNotationParser<label::StringLabel> bnp;
  ifstream test_cases_file;
  int local_394;
  long *local_390;
  size_t local_388;
  long local_380 [2];
  string local_370;
  char *local_350;
  long local_348;
  char local_340;
  undefined7 uStack_33f;
  string local_330;
  BracketNotationParser<label::StringLabel> local_310;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_250;
  long local_238 [4];
  byte abStack_218 [488];
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Tokens test.",0xc);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
  std::ostream::put(-0x60);
  std::ostream::flush();
  std::ifstream::ifstream((istream *)local_238,"parser_tokens_test_data.txt",_S_in);
  if ((abStack_218[*(long *)(local_238[0] + -0x18)] & 5) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"ERROR: Problem reading the test file.",0x25);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '\b');
    std::ostream::put('\b');
    std::ostream::flush();
  }
  local_350 = &local_340;
  local_348 = 0;
  local_340 = '\0';
  local_394 = 0;
  do {
    do {
      cVar2 = (char)(istream *)local_238;
      cVar1 = std::ios::widen((char)*(undefined8 *)(local_238[0] + -0x18) + cVar2);
      piVar5 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)local_238,(string *)&local_350,cVar1);
      if (((byte)piVar5[*(long *)(*(long *)piVar5 + -0x18) + 0x20] & 5) != 0) {
        local_394 = 0;
        goto LAB_00102979;
      }
    } while (*local_350 != '#');
    cVar1 = std::ios::widen((char)*(undefined8 *)(local_238[0] + -0x18) + cVar2);
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)local_238,(string *)&local_350,cVar1);
    local_370._M_dataplus._M_p = (pointer)&local_370.field_2;
    std::__cxx11::string::_M_construct<char*>((string *)&local_370,local_350,local_350 + local_348);
    cVar2 = std::ios::widen((char)*(undefined8 *)(local_238[0] + -0x18) + cVar2);
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)local_238,(string *)&local_350,cVar2);
    local_390 = local_380;
    std::__cxx11::string::_M_construct<char*>((string *)&local_390,local_350,local_350 + local_348);
    parser::BracketNotationParser<label::StringLabel>::BracketNotationParser(&local_310);
    bVar3 = parser::BracketNotationParser<label::StringLabel>::validate_input(&local_310,&local_370)
    ;
    if (bVar3) {
      parser::BracketNotationParser<label::StringLabel>::get_tokens
                (&local_250,&local_310,&local_370);
      vector_to_string(&local_330,&local_250);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_250);
      bVar3 = true;
      if (local_388 == local_330._M_string_length) {
        if (local_388 == 0) {
          bVar3 = false;
        }
        else {
          iVar4 = bcmp(local_390,local_330._M_dataplus._M_p,local_388);
          bVar3 = iVar4 != 0;
        }
      }
      if (bVar3) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Incorrect tokens: ",0x12);
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cerr,local_330._M_dataplus._M_p,
                            local_330._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6," instead of ",0xc);
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar6,(char *)local_390,local_388);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
        std::ostream::put((char)poVar6);
        std::ostream::flush();
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cerr,local_370._M_dataplus._M_p,
                            local_370._M_string_length);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
        std::ostream::put((char)poVar6);
        local_394 = -1;
        std::ostream::flush();
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_330._M_dataplus._M_p != &local_330.field_2) {
        operator_delete(local_330._M_dataplus._M_p,local_330.field_2._M_allocated_capacity + 1);
      }
      bVar3 = (bool)(bVar3 ^ 1);
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Incorrect format of input tree: \'",0x21);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,local_370._M_dataplus._M_p,
                          local_370._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar6,"\'. Is the number of opening and closing brackets equal?",0x37);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
      std::ostream::put((char)poVar6);
      std::ostream::flush();
      local_394 = -1;
      bVar3 = false;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_310.kMatchRightBracket._M_dataplus._M_p != &local_310.kMatchRightBracket.field_2) {
      operator_delete(local_310.kMatchRightBracket._M_dataplus._M_p,
                      local_310.kMatchRightBracket.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_310.kMatchLeftBracket._M_dataplus._M_p != &local_310.kMatchLeftBracket.field_2) {
      operator_delete(local_310.kMatchLeftBracket._M_dataplus._M_p,
                      local_310.kMatchLeftBracket.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_310.kStructureElements._M_dataplus._M_p != &local_310.kStructureElements.field_2) {
      operator_delete(local_310.kStructureElements._M_dataplus._M_p,
                      local_310.kStructureElements.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_310.kRightBracket._M_dataplus._M_p != &local_310.kRightBracket.field_2) {
      operator_delete(local_310.kRightBracket._M_dataplus._M_p,
                      local_310.kRightBracket.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_310.kLeftBracket._M_dataplus._M_p != &local_310.kLeftBracket.field_2) {
      operator_delete(local_310.kLeftBracket._M_dataplus._M_p,
                      local_310.kLeftBracket.field_2._M_allocated_capacity + 1);
    }
    if (local_310.node_stack.
        super__Vector_base<std::reference_wrapper<node::Node<label::StringLabel>_>,_std::allocator<std::reference_wrapper<node::Node<label::StringLabel>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_310.node_stack.
                      super__Vector_base<std::reference_wrapper<node::Node<label::StringLabel>_>,_std::allocator<std::reference_wrapper<node::Node<label::StringLabel>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_310.node_stack.
                            super__Vector_base<std::reference_wrapper<node::Node<label::StringLabel>_>,_std::allocator<std::reference_wrapper<node::Node<label::StringLabel>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_310.node_stack.
                            super__Vector_base<std::reference_wrapper<node::Node<label::StringLabel>_>,_std::allocator<std::reference_wrapper<node::Node<label::StringLabel>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_390 != local_380) {
      operator_delete(local_390,local_380[0] + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_370._M_dataplus._M_p != &local_370.field_2) {
      operator_delete(local_370._M_dataplus._M_p,local_370.field_2._M_allocated_capacity + 1);
    }
  } while (bVar3);
LAB_00102979:
  if (local_350 != &local_340) {
    operator_delete(local_350,CONCAT71(uStack_33f,local_340) + 1);
  }
  std::ifstream::~ifstream(local_238);
  return local_394;
}

Assistant:

int main() {

  using Label = label::StringLabel;
  
  std::cout << "Tokens test." << std::endl;

  // Parse test cases from file.
  std::ifstream test_cases_file("parser_tokens_test_data.txt");

  if (!test_cases_file) {
    std::cerr << "ERROR: Problem reading the test file." << std::endl;
  }

  for (std::string line; std::getline( test_cases_file, line);) {
    if (line[0] == '#') {
      std::getline(test_cases_file, line);
      std::string input_tree = line;
      std::getline(test_cases_file, line);
      std::string correct_result = line;

      parser::BracketNotationParser<Label> bnp;

      // Validate test tree.
      if (!bnp.validate_input(input_tree)) {
        std::cerr << "Incorrect format of input tree: '" << input_tree << "'. Is the number of opening and closing brackets equal?" << std::endl;
        return -1;
      }
      // Parse test tree.
      std::string computed_results = vector_to_string(bnp.get_tokens(input_tree));

      if (correct_result != computed_results) {
        std::cerr << "Incorrect tokens: " << computed_results << " instead of " << correct_result << std::endl;
        std::cerr << input_tree << std::endl;
        return -1;
      }
    }
  }

  return 0;
}